

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ASEParser.cpp
# Opt level: O2

void __thiscall Assimp::ASE::Parser::ParseLV1ObjectBlock(Parser *this,BaseNode *node)

{
  char cVar1;
  Type TVar2;
  bool bVar3;
  int iVar4;
  uint uVar5;
  char *pcVar6;
  string *out;
  int iVar7;
  
  iVar7 = 0;
LAB_003cdc26:
  pcVar6 = this->filePtr;
  cVar1 = *pcVar6;
  if (cVar1 == '*') {
    this->filePtr = pcVar6 + 1;
    bVar3 = TokenMatch<char_const>(&this->filePtr,"NODE_NAME",9);
    if (bVar3) {
      pcVar6 = "*NODE_NAME";
      out = &node->mName;
LAB_003cdcd8:
      bVar3 = ParseString(this,out,pcVar6);
      if (!bVar3) {
        SkipToNextToken(this);
      }
      goto LAB_003cdc26;
    }
    bVar3 = TokenMatch<char_const>(&this->filePtr,"NODE_PARENT",0xb);
    if (bVar3) {
      pcVar6 = "*NODE_PARENT";
      out = &node->mParent;
      goto LAB_003cdcd8;
    }
    bVar3 = TokenMatch<char_const>(&this->filePtr,"NODE_TM",7);
    if (bVar3) {
      ParseLV2NodeTransformBlock(this,node);
      goto LAB_003cdc26;
    }
    bVar3 = TokenMatch<char_const>(&this->filePtr,"TM_ANIMATION",0xc);
    if (bVar3) {
      ParseLV2AnimationBlock(this,node);
      goto LAB_003cdc26;
    }
    TVar2 = node->mType;
    if (TVar2 == Mesh) {
      bVar3 = TokenMatch<char_const>(&this->filePtr,"MESH",4);
      if (bVar3) {
LAB_003cddcd:
        ParseLV2MeshBlock(this,(Mesh *)&node[-1].mTargetAnim.akeyRotations.
                                        super__Vector_base<aiQuatKey,_std::allocator<aiQuatKey>_>.
                                        _M_impl.super__Vector_impl_data._M_finish);
      }
      else {
        bVar3 = TokenMatch<char_const>(&this->filePtr,"MESH_SOFTSKIN",0xd);
        if (bVar3) goto LAB_003cddcd;
        bVar3 = TokenMatch<char_const>(&this->filePtr,"MATERIAL_REF",0xc);
        if (!bVar3) goto LAB_003cdc7d;
        ParseLV4MeshLong(this,(uint *)&node[1].mTargetAnim.akeyRotations);
      }
      goto LAB_003cdc26;
    }
    if (TVar2 == Camera) {
      bVar3 = TokenMatch<char_const>(&this->filePtr,"CAMERA_SETTINGS",0xf);
      if (bVar3) {
        ParseLV2CameraSettingsBlock(this,(Camera *)node);
        goto LAB_003cdc26;
      }
      bVar3 = TokenMatch<char_const>(&this->filePtr,"CAMERA_TYPE",0xb);
      if (bVar3) {
        iVar4 = ASSIMP_strincmp("target",this->filePtr,6);
        if (iVar4 == 0) {
          *(undefined4 *)&node[1].mName._M_dataplus._M_p = 1;
        }
        else {
          iVar4 = ASSIMP_strincmp("free",this->filePtr,4);
          if (iVar4 == 0) {
            *(undefined4 *)&node[1].mName._M_dataplus._M_p = 0;
          }
          else {
            LogWarning(this,"Unknown kind of camera");
          }
        }
        goto LAB_003cdc26;
      }
    }
    else if (TVar2 == Light) {
      bVar3 = TokenMatch<char_const>(&this->filePtr,"LIGHT_SETTINGS",0xe);
      if (bVar3) {
        ParseLV2LightSettingsBlock(this,(Light *)node);
      }
      else {
        bVar3 = TokenMatch<char_const>(&this->filePtr,"LIGHT_TYPE",10);
        if (!bVar3) goto LAB_003cdc7d;
        iVar4 = ASSIMP_strincmp("omni",this->filePtr,4);
        if (iVar4 == 0) {
          *(undefined4 *)&node->field_0x154 = 0;
        }
        else {
          iVar4 = ASSIMP_strincmp("target",this->filePtr,6);
          if (iVar4 == 0) {
            *(undefined4 *)&node->field_0x154 = 1;
          }
          else {
            iVar4 = ASSIMP_strincmp("free",this->filePtr,4);
            if (iVar4 == 0) {
              *(undefined4 *)&node->field_0x154 = 2;
            }
            else {
              iVar4 = ASSIMP_strincmp("directional",this->filePtr,0xb);
              if (iVar4 == 0) {
                *(undefined4 *)&node->field_0x154 = 3;
              }
              else {
                LogWarning(this,"Unknown kind of light source");
              }
            }
          }
        }
      }
      goto LAB_003cdc26;
    }
  }
  else if (cVar1 == '{') {
    iVar7 = iVar7 + 1;
  }
  else if (cVar1 == '}') {
    iVar7 = iVar7 + -1;
    if (iVar7 == 0) {
      this->filePtr = pcVar6 + 1;
      SkipToNextToken(this);
      return;
    }
  }
  else if (cVar1 == '\0') {
    return;
  }
LAB_003cdc7d:
  bVar3 = false;
  uVar5 = (uint)(byte)*this->filePtr;
  if ((uVar5 < 0xe) && ((0x3401U >> (uVar5 & 0x1f) & 1) != 0)) {
    if (this->bLastWasEndLine == false) {
      this->iLineNumber = this->iLineNumber + 1;
      bVar3 = true;
    }
    else {
      bVar3 = false;
    }
  }
  this->bLastWasEndLine = bVar3;
  this->filePtr = this->filePtr + 1;
  goto LAB_003cdc26;
}

Assistant:

void Parser::ParseLV1ObjectBlock(ASE::BaseNode& node)
{
    AI_ASE_PARSER_INIT();
    while (true)
    {
        if ('*' == *filePtr)
        {
            ++filePtr;

            // first process common tokens such as node name and transform
            // name of the mesh/node
            if (TokenMatch(filePtr,"NODE_NAME" ,9))
            {
                if(!ParseString(node.mName,"*NODE_NAME"))
                    SkipToNextToken();
                continue;
            }
            // name of the parent of the node
            if (TokenMatch(filePtr,"NODE_PARENT" ,11) )
            {
                if(!ParseString(node.mParent,"*NODE_PARENT"))
                    SkipToNextToken();
                continue;
            }
            // transformation matrix of the node
            if (TokenMatch(filePtr,"NODE_TM" ,7))
            {
                ParseLV2NodeTransformBlock(node);
                continue;
            }
            // animation data of the node
            if (TokenMatch(filePtr,"TM_ANIMATION" ,12))
            {
                ParseLV2AnimationBlock(node);
                continue;
            }

            if (node.mType == BaseNode::Light)
            {
                // light settings
                if (TokenMatch(filePtr,"LIGHT_SETTINGS" ,14))
                {
                    ParseLV2LightSettingsBlock((ASE::Light&)node);
                    continue;
                }
                // type of the light source
                if (TokenMatch(filePtr,"LIGHT_TYPE" ,10))
                {
                    if (!ASSIMP_strincmp("omni",filePtr,4))
                    {
                        ((ASE::Light&)node).mLightType = ASE::Light::OMNI;
                    }
                    else if (!ASSIMP_strincmp("target",filePtr,6))
                    {
                        ((ASE::Light&)node).mLightType = ASE::Light::TARGET;
                    }
                    else if (!ASSIMP_strincmp("free",filePtr,4))
                    {
                        ((ASE::Light&)node).mLightType = ASE::Light::FREE;
                    }
                    else if (!ASSIMP_strincmp("directional",filePtr,11))
                    {
                        ((ASE::Light&)node).mLightType = ASE::Light::DIRECTIONAL;
                    }
                    else
                    {
                        LogWarning("Unknown kind of light source");
                    }
                    continue;
                }
            }
            else if (node.mType == BaseNode::Camera)
            {
                // Camera settings
                if (TokenMatch(filePtr,"CAMERA_SETTINGS" ,15))
                {
                    ParseLV2CameraSettingsBlock((ASE::Camera&)node);
                    continue;
                }
                else if (TokenMatch(filePtr,"CAMERA_TYPE" ,11))
                {
                    if (!ASSIMP_strincmp("target",filePtr,6))
                    {
                        ((ASE::Camera&)node).mCameraType = ASE::Camera::TARGET;
                    }
                    else if (!ASSIMP_strincmp("free",filePtr,4))
                    {
                        ((ASE::Camera&)node).mCameraType = ASE::Camera::FREE;
                    }
                    else
                    {
                        LogWarning("Unknown kind of camera");
                    }
                    continue;
                }
            }
            else if (node.mType == BaseNode::Mesh)
            {
                // mesh data
                // FIX: Older files use MESH_SOFTSKIN
                if (TokenMatch(filePtr,"MESH" ,4) ||
                    TokenMatch(filePtr,"MESH_SOFTSKIN",13))
                {
                    ParseLV2MeshBlock((ASE::Mesh&)node);
                    continue;
                }
                // mesh material index
                if (TokenMatch(filePtr,"MATERIAL_REF" ,12))
                {
                    ParseLV4MeshLong(((ASE::Mesh&)node).iMaterialIndex);
                    continue;
                }
            }
        }
        AI_ASE_HANDLE_TOP_LEVEL_SECTION();
    }
    return;
}